

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O0

void __thiscall
pzgeom::TPZNodeRep<3,_pztopology::TPZTriangle>::TPZNodeRep
          (TPZNodeRep<3,_pztopology::TPZTriangle> *this,TPZVec<long> *nodeindexes)

{
  int64_t iVar1;
  long *__src;
  TPZVec<long> *in_RSI;
  TPZRegisterClassId *in_RDI;
  int i;
  int nn;
  void **in_stack_ffffffffffffffa8;
  TPZTriangle *in_stack_ffffffffffffffb0;
  int local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZNodeRep<3,pztopology::TPZTriangle>>(in_RDI,0x21)
  ;
  pztopology::TPZTriangle::TPZTriangle(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__TPZNodeRep_0244fd60;
  iVar1 = TPZVec<long>::NElements(in_RSI);
  if (iVar1 < 3) {
    iVar1 = TPZVec<long>::NElements(in_RSI);
    local_38 = (int)iVar1;
  }
  else {
    local_38 = 3;
  }
  __src = TPZVec<long>::operator[](in_RSI,0);
  memcpy(in_RDI + 8,__src,(long)local_38 << 3);
  for (; local_38 < 3; local_38 = local_38 + 1) {
    *(undefined8 *)(in_RDI + (long)local_38 * 8 + 8) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

TPZNodeRep(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZNodeRep::ClassId)
        {
            int nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifdef PZDEBUG
            if(nn<N)
            {
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
        }